

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

string * __thiscall
cfd::core::DescriptorKeyInfo::ToString_abi_cxx11_
          (string *__return_storage_ptr__,DescriptorKeyInfo *this)

{
  bool bVar1;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  switch(this->key_type_) {
  case kDescriptorKeyPublic:
    bVar1 = Privkey::IsValid(&this->privkey_);
    if (bVar1) {
      ::std::operator+(__return_storage_ptr__,&this->parent_info_,&this->key_string_);
      return __return_storage_ptr__;
    }
    Pubkey::GetHex_abi_cxx11_(&local_60,&this->pubkey_);
    ::std::operator+(__return_storage_ptr__,&this->parent_info_,&local_60);
    this_00 = &local_60;
    goto LAB_002b0e7c;
  case kDescriptorKeyBip32:
    ExtPubkey::ToString_abi_cxx11_(&local_40,&this->extpubkey_);
    ::std::operator+(&local_60,&this->parent_info_,&local_40);
    ::std::operator+(__return_storage_ptr__,&local_60,&this->path_);
    break;
  case kDescriptorKeyBip32Priv:
    ExtPrivkey::ToString_abi_cxx11_(&local_40,&this->extprivkey_);
    ::std::operator+(&local_60,&this->parent_info_,&local_40);
    ::std::operator+(__return_storage_ptr__,&local_60,&this->path_);
    break;
  case kDescriptorKeySchnorr:
    SchnorrPubkey::GetHex_abi_cxx11_(&local_40,&this->schnorr_pubkey_);
    ::std::operator+(&local_60,&this->parent_info_,&local_40);
    ::std::operator+(__return_storage_ptr__,&local_60,&this->path_);
    break;
  default:
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_60);
    return __return_storage_ptr__;
  }
  ::std::__cxx11::string::~string((string *)&local_60);
  this_00 = &local_40;
LAB_002b0e7c:
  ::std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string DescriptorKeyInfo::ToString() const {
  if (key_type_ == DescriptorKeyType::kDescriptorKeyPublic) {
    if (privkey_.IsValid()) {
      return parent_info_ + key_string_;
    } else {
      return parent_info_ + pubkey_.GetHex();
    }
  } else if (key_type_ == DescriptorKeyType::kDescriptorKeyBip32) {
    return parent_info_ + extpubkey_.ToString() + path_;
  } else if (key_type_ == DescriptorKeyType::kDescriptorKeyBip32Priv) {
    return parent_info_ + extprivkey_.ToString() + path_;
  } else if (key_type_ == DescriptorKeyType::kDescriptorKeySchnorr) {
    return parent_info_ + schnorr_pubkey_.GetHex() + path_;
  } else {
    return "";
  }
}